

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this,cmSourceFile *source)

{
  ulong uVar1;
  size_type sVar2;
  allocator<char> local_61;
  key_type *local_60;
  string *ext;
  string local_48;
  string *local_28;
  string *lang;
  cmSourceFile *source_local;
  cmGlobalGenerator *this_local;
  
  lang = (string *)source;
  source_local = (cmSourceFile *)this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  cmSourceFile::GetLanguage_abi_cxx11_(&local_48,source);
  local_28 = &local_48;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    GetLanguageOutputExtension(__return_storage_ptr__,this,local_28);
  }
  else {
    local_60 = cmSourceFile::GetExtension_abi_cxx11_((cmSourceFile *)lang);
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) &&
       (sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::count(&this->OutputExtensions,local_60), sVar2 != 0)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_60);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_61);
      std::allocator<char>::~allocator(&local_61);
    }
  }
  ext._0_4_ = 1;
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    return this->GetLanguageOutputExtension(lang);
  }
  // if no language is found then check to see if it is already an
  // output extension for some language.  In that case it should be ignored
  // and in this map, so it will not be compiled but will just be used.
  std::string const& ext = source.GetExtension();
  if (!ext.empty()) {
    if (this->OutputExtensions.count(ext)) {
      return ext;
    }
  }
  return "";
}